

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block>
::InnerMap::TransferList(InnerMap *this,void **table,size_type index)

{
  size_type b;
  iterator local_48;
  Node *local_30;
  Node *next;
  Node *node;
  size_type index_local;
  void **table_local;
  InnerMap *this_local;
  
  next = (Node *)table[index];
  node = (Node *)index;
  index_local = (size_type)table;
  table_local = (void **)this;
  do {
    local_30 = next->next;
    b = Map<std::__cxx11::string,CoreML::Specification::MILSpec::Block>::InnerMap::
        BucketNumber<std::__cxx11::string>
                  ((InnerMap *)this,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)next);
    InsertUnique(&local_48,this,b,next);
    next = local_30;
  } while (local_30 != (Node *)0x0);
  return;
}

Assistant:

void TransferList(void* const* table, size_type index) {
      Node* node = static_cast<Node*>(table[index]);
      do {
        Node* next = node->next;
        InsertUnique(BucketNumber(node->kv.first), node);
        node = next;
      } while (node != nullptr);
    }